

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

Matrix<Rational> __thiscall Matrix<Rational>::power(Matrix<Rational> *this,BigInteger *pow)

{
  uint n;
  compare_t cVar1;
  matrix_error *this_00;
  BigInteger *in_RDX;
  Rational *extraout_RDX;
  bool bVar2;
  Matrix<Rational> MVar3;
  BigInteger p;
  Matrix<Rational> t;
  Matrix<Rational> a;
  BigInteger local_90;
  Matrix<Rational> local_70;
  Matrix<Rational> local_60;
  BigInteger local_50;
  
  n = *(uint *)((long)&(pow->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4);
  if (*(uint *)&(pow->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start == n) {
    identity(&local_70,n);
    Matrix(&local_60,(Matrix<Rational> *)pow);
    BigInteger::BigInteger(&local_50,0);
    cVar1 = BigInteger::_compare(in_RDX,&local_50);
    if (cVar1 == CMP_LESS) {
      BigInteger::operator-(&local_90,in_RDX);
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_90.digits,&in_RDX->digits);
      local_90.negative = in_RDX->negative;
    }
    if (local_50.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_90.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_90.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar2 = false;
      do {
        if ((*local_90.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start & 1) != 0) {
          if (bVar2) {
            operator*((Matrix<Rational> *)&local_50,&local_70);
            operator=(&local_70,(Matrix<Rational> *)&local_50);
            ~Matrix((Matrix<Rational> *)&local_50);
            bVar2 = true;
          }
          else {
            bVar2 = true;
            operator=(&local_70,&local_60);
          }
        }
        BigInteger::_divide_by_2(&local_90);
        if (local_90.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_90.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          operator*((Matrix<Rational> *)&local_50,&local_60);
          operator=(&local_60,(Matrix<Rational> *)&local_50);
          ~Matrix((Matrix<Rational> *)&local_50);
        }
      } while (local_90.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start !=
               local_90.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    BigInteger::BigInteger(&local_50,0);
    cVar1 = BigInteger::_compare(in_RDX,&local_50);
    if (cVar1 == CMP_LESS) {
      inverted(this);
    }
    else {
      Matrix(this,&local_70);
    }
    if (local_50.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_90.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ~Matrix(&local_60);
    ~Matrix(&local_70);
    MVar3.arr = extraout_RDX;
    MVar3._0_8_ = this;
    return MVar3;
  }
  this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
  matrix_error::runtime_error(this_00,"Power is only defined for square matrices");
  __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Matrix<Field> Matrix<Field>::power(const BigInteger &pow) const
{
    if(M != N)
        throw matrix_error("Power is only defined for square matrices");
    Matrix t = identity(width());
    bool t_set = false;
    Matrix a(*this);
    BigInteger p = abs(pow);
    while(p)
    {
        if(p.odd())
        {
            if(t_set)
                t *= a;
            else
                t = a;
            t_set = true;
        }
        p._divide_by_2();
        if(p)
            a *= a;
    }
    return pow < 0 ? t.inverted() : t;
}